

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

bool __thiscall
simple_thread_pool::ThreadPoolMgr::returnThread
          (ThreadPoolMgr *this,shared_ptr<simple_thread_pool::ThreadHandle> *t_handle)

{
  element_type *peVar1;
  unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
  *this_00;
  long in_RDI;
  iterator entry;
  lock_guard<std::mutex> l;
  unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
  *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  value_type *in_stack_ffffffffffffff48;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  local_48 [3];
  size_t local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  local_28 [4];
  bool local_1;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40)
             ,(mutex_type *)in_stack_ffffffffffffff38);
  peVar1 = std::
           __shared_ptr_access<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10bb75);
  local_30 = ThreadHandle::getId(peVar1);
  local_28[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x10bba3);
  local_48[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
       ::end(in_stack_ffffffffffffff38);
  local_1 = std::__detail::operator!=(local_28,local_48);
  if (!local_1) {
    this_00 = (unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
               *)(in_RDI + 0x120);
    peVar1 = std::
             __shared_ptr_access<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x10bc36);
    ThreadHandle::getId(peVar1);
    std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>::
    pair<unsigned_long,_true>
              ((pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (unsigned_long *)in_stack_ffffffffffffff38,
               (shared_ptr<simple_thread_pool::ThreadHandle> *)0x10bc66);
    std::
    unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
    ::insert(this_00,in_stack_ffffffffffffff48);
    std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>::~pair
              ((pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_> *)
               0x10bc9e);
  }
  local_1 = !local_1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10bcdd);
  return (bool)(local_1 & 1);
}

Assistant:

bool returnThread(const std::shared_ptr<ThreadHandle>& t_handle) {
        std::lock_guard<std::mutex> l(idleThreadsLock);
        auto entry = idleThreads.find(t_handle->getId());
        if (entry != idleThreads.end()) {
            return false;
        }
        idleThreads.insert({t_handle->getId(), t_handle});
        return true;
    }